

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestIO.h
# Opt level: O3

string * RelativeURLToLocalPath
                   (string *__return_storage_ptr__,FileURL *inFileURL,string *inRelativeURL)

{
  string *extraout_RAX;
  PosixPath PStack_78;
  FileURL local_58;
  FileURL local_38;
  
  FileURL::FileURL(&local_38,inRelativeURL);
  FileURL::InterpretFrom(&local_58,&local_38,inFileURL);
  PosixPath::PosixPath(&PStack_78);
  PosixPath::FromFileURL(&PStack_78,&local_58);
  PosixPath::ToString_abi_cxx11_(__return_storage_ptr__,&PStack_78);
  PosixPath::~PosixPath(&PStack_78);
  FileURL::~FileURL(&local_58);
  FileURL::~FileURL(&local_38);
  return extraout_RAX;
}

Assistant:

static string RelativeURLToLocalPath(const FileURL& inFileURL,const string& inRelativeURL)
{
    return FileURLToLocalPath(FileURL(inRelativeURL).InterpretFrom(inFileURL));
}